

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTHumidityHTS221.cpp
# Opt level: O0

bool __thiscall RTHumidityHTS221::humidityInit(RTHumidityHTS221 *this)

{
  ushort uVar1;
  ushort uVar2;
  int16_t iVar3;
  int16_t iVar4;
  int16_t iVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float T1;
  float T0;
  float H1;
  float H0;
  int16_t T1_OUT;
  int16_t T0_OUT;
  int16_t H1_T0_OUT;
  int16_t H0_T0_OUT;
  uint16_t T1_C_8;
  uint16_t T0_C_8;
  uint8_t H1_H_2;
  uint8_t H0_H_2;
  uchar rawData [2];
  RTHumidityHTS221 *this_local;
  
  H1_T0_OUT._1_1_ = 0;
  H1_T0_OUT._0_1_ = 0;
  this->m_humidityAddr = ((this->super_RTHumidity).m_settings)->m_I2CHumidityAddress;
  _T1_C_8 = this;
  bVar6 = RTIMUHal::HALWrite(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                             this->m_humidityAddr,' ',0x87,"Failed to set HTS221 CTRL_REG_1");
  if (bVar6) {
    bVar6 = RTIMUHal::HALWrite(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                               this->m_humidityAddr,'\x10','\x1b',"Failed to set HTS221 AV_CONF");
    if (bVar6) {
      bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                this->m_humidityAddr,0xb5,'\x01',(uchar *)((long)&H0_T0_OUT + 1),
                                "Failed to read HTS221 T1_T0");
      if (bVar6) {
        bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                  this->m_humidityAddr,0xb2,'\x01',(uchar *)&H0_T0_OUT,
                                  "Failed to read HTS221 T0_C_8");
        if (bVar6) {
          fVar9 = (float)(ushort)(((ushort)H0_T0_OUT >> 8 & 3) << 8 | H0_T0_OUT & 0xffU) / 8.0;
          bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                    this->m_humidityAddr,0xb3,'\x01',(uchar *)&H0_T0_OUT,
                                    "Failed to read HTS221 T1_C_8");
          if (bVar6) {
            uVar2 = (ushort)H0_T0_OUT >> 8;
            uVar1 = H0_T0_OUT & 0xff;
            bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                      this->m_humidityAddr,0xbc,'\x02',(uchar *)&H0_T0_OUT,
                                      "Failed to read HTS221 T0_OUT");
            iVar3 = H0_T0_OUT;
            if (bVar6) {
              bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                        this->m_humidityAddr,0xbe,'\x02',(uchar *)&H0_T0_OUT,
                                        "Failed to read HTS221 T1_OUT");
              iVar4 = H0_T0_OUT;
              if (bVar6) {
                bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                          this->m_humidityAddr,0xb0,'\x01',
                                          (uchar *)((long)&H1_T0_OUT + 1),
                                          "Failed to read HTS221 H0_H_2");
                if (bVar6) {
                  uVar7 = (uint)H1_T0_OUT._1_1_;
                  bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                            this->m_humidityAddr,0xb1,'\x01',(uchar *)&H1_T0_OUT,
                                            "Failed to read HTS221 H1_H_2");
                  if (bVar6) {
                    uVar8 = (uint)(byte)H1_T0_OUT;
                    bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal
                                              ,this->m_humidityAddr,0xb6,'\x02',(uchar *)&H0_T0_OUT,
                                              "Failed to read HTS221 H0_T_OUT");
                    iVar5 = H0_T0_OUT;
                    if (bVar6) {
                      bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->
                                                 super_RTIMUHal,this->m_humidityAddr,0xba,'\x02',
                                                (uchar *)&H0_T0_OUT,"Failed to read HTS221 H1_T_OUT"
                                               );
                      if (bVar6) {
                        this->m_temperature_m =
                             ((float)(ushort)((uVar2 & 0xc) << 6 | uVar1) / 8.0 - fVar9) /
                             (float)((int)iVar4 - (int)iVar3);
                        this->m_temperature_c = -this->m_temperature_m * (float)(int)iVar3 + fVar9;
                        this->m_humidity_m =
                             ((float)uVar8 / 2.0 - (float)uVar7 / 2.0) /
                             (float)((int)H0_T0_OUT - (int)iVar5);
                        this->m_humidity_c =
                             -this->m_humidity_m * (float)(int)iVar5 + (float)uVar7 / 2.0;
                        this_local._7_1_ = true;
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTHumidityHTS221::humidityInit()
{
    unsigned char rawData[2];
    uint8_t H0_H_2 = 0;
    uint8_t H1_H_2 = 0;
    uint16_t T0_C_8 = 0;
    uint16_t T1_C_8 = 0;
    int16_t H0_T0_OUT = 0;
    int16_t H1_T0_OUT = 0;
    int16_t T0_OUT = 0;
    int16_t T1_OUT = 0;
    float H0, H1, T0, T1;

    m_humidityAddr = m_settings->m_I2CHumidityAddress;

    if (!m_settings->HALWrite(m_humidityAddr, HTS221_CTRL1, 0x87, "Failed to set HTS221 CTRL_REG_1"))
        return false;

    if (!m_settings->HALWrite(m_humidityAddr, HTS221_AV_CONF, 0x1b, "Failed to set HTS221 AV_CONF"))
        return false;

    // Get calibration data

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T1_T0 + 0x80, 1, &rawData[1], "Failed to read HTS221 T1_T0"))
        return false;
    if (!m_settings->HALRead(m_humidityAddr, HTS221_T0_C_8 + 0x80, 1, rawData, "Failed to read HTS221 T0_C_8"))
        return false;
    T0_C_8 = (((unsigned int)rawData[1] & 0x3 ) << 8) | (unsigned int)rawData[0];
    T0 = (RTFLOAT)T0_C_8 / 8;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T1_C_8 + 0x80, 1, rawData, "Failed to read HTS221 T1_C_8"))
        return false;
    T1_C_8 = (unsigned int)(((uint16_t)(rawData[1] & 0xC) << 6) | (uint16_t)rawData[0]);
    T1 = (RTFLOAT)T1_C_8 / 8;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T0_OUT + 0x80, 2, rawData, "Failed to read HTS221 T0_OUT"))
        return false;
    T0_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T1_OUT + 0x80, 2, rawData, "Failed to read HTS221 T1_OUT"))
        return false;
    T1_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];

    if (!m_settings->HALRead(m_humidityAddr, HTS221_H0_H_2 + 0x80, 1, &H0_H_2, "Failed to read HTS221 H0_H_2"))
        return false;
    H0 = (RTFLOAT)H0_H_2 / 2;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_H1_H_2 + 0x80, 1, &H1_H_2, "Failed to read HTS221 H1_H_2"))
        return false;
    H1 = (RTFLOAT)H1_H_2 / 2;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_H0_T0_OUT + 0x80, 2, rawData, "Failed to read HTS221 H0_T_OUT"))
        return false;
    H0_T0_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];


    if (!m_settings->HALRead(m_humidityAddr, HTS221_H1_T0_OUT + 0x80, 2, rawData, "Failed to read HTS221 H1_T_OUT"))
        return false;
    H1_T0_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];

    m_temperature_m = (T1-T0)/(T1_OUT-T0_OUT);
    m_temperature_c = T0-(m_temperature_m*T0_OUT);
    m_humidity_m = (H1-H0)/(H1_T0_OUT-H0_T0_OUT);
    m_humidity_c = (H0)-(m_humidity_m*H0_T0_OUT);

    return true;
}